

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O2

bool google::protobuf::compiler::java::anon_unknown_0::CollectExtensions
               (Message *message,FieldDescriptorSet *extensions)

{
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  _Rb_tree_node_base *p_Var3;
  pointer ppFVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  JavaType JVar8;
  undefined4 extraout_var;
  long *plVar10;
  ulong uVar11;
  pointer p_Var12;
  Message *pMVar13;
  _Base_ptr *pp_Var14;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *f2;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *extraout_RDX_05;
  _Rb_tree_node_base *p_Var15;
  int iVar16;
  int i;
  ulong uVar17;
  _Alloc_node __an;
  undefined1 auVar18 [16];
  bool local_69;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  long *plVar9;
  
  iVar7 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])();
  plVar9 = (long *)CONCAT44(extraout_var,iVar7);
  plVar10 = (long *)(**(code **)(*plVar9 + 0x10))(plVar9,message);
  plVar10 = (long *)*plVar10;
  if ((plVar10 == (long *)0x0) || ((int)((ulong)(plVar10[1] - *plVar10) >> 4) < 1)) {
    fields.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    fields.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    fields.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (**(code **)(*plVar9 + 0x80))(plVar9,message);
    p_Var1 = &(extensions->_M_t)._M_impl.super__Rb_tree_header;
    uVar17 = 0;
    f2 = extraout_RDX;
    while( true ) {
      ppFVar4 = fields.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar11 = (long)fields.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)fields.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
      bVar6 = uVar11 <= uVar17;
      if (uVar11 <= uVar17) break;
      if (fields.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar17][0x50] == (FieldDescriptor)0x1) {
        bVar5 = true;
        pp_Var14 = &(extensions->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var15 = &p_Var1->_M_header;
        while (auVar18._8_8_ = f2, auVar18._0_8_ = p_Var15, p_Var3 = *pp_Var14,
              p_Var3 != (_Rb_tree_node_base *)0x0) {
          bVar5 = FieldDescriptorCompare::operator()
                            ((FieldDescriptorCompare *)ppFVar4[uVar17],
                             *(FieldDescriptor **)(p_Var3 + 1),f2);
          f2 = extraout_RDX_00;
          p_Var15 = p_Var3;
          pp_Var14 = &p_Var3->_M_left + !bVar5;
        }
        if (bVar5 == false) {
LAB_0028c8c5:
          bVar5 = FieldDescriptorCompare::operator()
                            (*(FieldDescriptorCompare **)(auVar18._0_8_ + 0x20),ppFVar4[uVar17],
                             auVar18._8_8_);
          f2 = extraout_RDX_01;
          if (!bVar5) goto LAB_0028c924;
        }
        else if (p_Var15 != (extensions->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left) {
          auVar18 = std::_Rb_tree_decrement(p_Var15);
          goto LAB_0028c8c5;
        }
        if (p_Var1 == (_Rb_tree_header *)p_Var15) {
          local_69 = true;
        }
        else {
          local_69 = FieldDescriptorCompare::operator()
                               ((FieldDescriptorCompare *)ppFVar4[uVar17],
                                *(FieldDescriptor **)(p_Var15 + 1),f2);
        }
        p_Var12 = std::
                  allocator_traits<std::allocator<std::_Rb_tree_node<const_google::protobuf::FieldDescriptor_*>_>_>
                  ::allocate((allocator_type *)extensions,1);
        *(FieldDescriptor **)(p_Var12->_M_storage)._M_storage = ppFVar4[uVar17];
        std::_Rb_tree_insert_and_rebalance
                  (local_69,&p_Var12->super__Rb_tree_node_base,p_Var15,&p_Var1->_M_header);
        psVar2 = &(extensions->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
        *psVar2 = *psVar2 + 1;
      }
LAB_0028c924:
      JVar8 = GetJavaType(fields.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar17]);
      f2 = extraout_RDX_02;
      if (JVar8 == JAVATYPE_MESSAGE) {
        if (*(int *)(fields.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar17] + 0x4c) == 3) {
          iVar7 = (**(code **)(*plVar9 + 0x30))(plVar9,message);
          iVar16 = 0;
          f2 = extraout_RDX_03;
          if (iVar7 < 1) {
            iVar7 = iVar16;
          }
          while (iVar7 != iVar16) {
            pMVar13 = (Message *)
                      (**(code **)(*plVar9 + 0x1a0))
                                (plVar9,message,
                                 fields.
                                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar17]);
            bVar6 = CollectExtensions(pMVar13,extensions);
            iVar16 = iVar16 + 1;
            f2 = extraout_RDX_04;
            if (!bVar6) {
              bVar6 = false;
              goto LAB_0028c9c6;
            }
          }
        }
        else {
          pMVar13 = (Message *)
                    (**(code **)(*plVar9 + 0xd8))
                              (plVar9,message,
                               fields.
                               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar17],0);
          bVar5 = CollectExtensions(pMVar13,extensions);
          f2 = extraout_RDX_05;
          if (!bVar5) goto LAB_0028c9c6;
        }
      }
      uVar17 = uVar17 + 1;
    }
    bVar6 = true;
LAB_0028c9c6:
    std::
    _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::~_Vector_base(&fields.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   );
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool CollectExtensions(const Message& message,
                       FieldDescriptorSet* extensions) {
  const Reflection* reflection = message.GetReflection();

  // There are unknown fields that could be extensions, thus this call fails.
  if (reflection->GetUnknownFields(message).field_count() > 0) return false;

  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(message, &fields);

  for (int i = 0; i < fields.size(); i++) {
    if (fields[i]->is_extension()) extensions->insert(fields[i]);

    if (GetJavaType(fields[i]) == JAVATYPE_MESSAGE) {
      if (fields[i]->is_repeated()) {
        int size = reflection->FieldSize(message, fields[i]);
        for (int j = 0; j < size; j++) {
          const Message& sub_message =
            reflection->GetRepeatedMessage(message, fields[i], j);
          if (!CollectExtensions(sub_message, extensions)) return false;
        }
      } else {
        const Message& sub_message = reflection->GetMessage(message, fields[i]);
        if (!CollectExtensions(sub_message, extensions)) return false;
      }
    }
  }

  return true;
}